

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

Instance *
instance_copy(Instance *__return_storage_ptr__,Instance *instance,_Bool allocate,_Bool deep_copy)

{
  double *__src;
  int n_00;
  int64_t iVar1;
  double *pdVar2;
  Vec2d *pVVar3;
  char *pcVar4;
  Instance *result;
  int32_t n;
  _Bool deep_copy_local;
  _Bool allocate_local;
  Instance *instance_local;
  
  memset(__return_storage_ptr__,0,0x48);
  n_00 = instance->num_customers + 1;
  __return_storage_ptr__->num_customers = instance->num_customers;
  __return_storage_ptr__->num_vehicles = instance->num_vehicles;
  __return_storage_ptr__->vehicle_cap = instance->vehicle_cap;
  if (allocate) {
    if (instance->edge_weight != (double *)0x0) {
      iVar1 = hm_nentries(n_00);
      pdVar2 = (double *)malloc(iVar1 << 3);
      __return_storage_ptr__->edge_weight = pdVar2;
    }
    pdVar2 = (double *)malloc((long)n_00 << 3);
    __return_storage_ptr__->profits = pdVar2;
    pdVar2 = (double *)malloc((long)n_00 << 3);
    __return_storage_ptr__->demands = pdVar2;
    pVVar3 = (Vec2d *)malloc((long)n_00 << 4);
    __return_storage_ptr__->positions = pVVar3;
    pcVar4 = strdup(instance->name);
    __return_storage_ptr__->name = pcVar4;
    pcVar4 = strdup(instance->comment);
    __return_storage_ptr__->comment = pcVar4;
  }
  if (deep_copy) {
    memcpy(__return_storage_ptr__->profits,instance->profits,(long)n_00 << 3);
    memcpy(__return_storage_ptr__->demands,instance->demands,(long)n_00 << 3);
    memcpy(__return_storage_ptr__->positions,instance->positions,(long)n_00 << 4);
    if (instance->edge_weight != (double *)0x0) {
      pdVar2 = __return_storage_ptr__->edge_weight;
      __src = instance->edge_weight;
      iVar1 = hm_nentries(n_00);
      memcpy(pdVar2,__src,iVar1 << 3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Instance instance_copy(const Instance *instance, bool allocate,
                       bool deep_copy) {
    Instance result = {0};
    int32_t n = instance->num_customers + 1;

    result.num_customers = instance->num_customers;
    result.num_vehicles = instance->num_vehicles;
    result.vehicle_cap = instance->vehicle_cap;

    if (allocate) {
        if (instance->edge_weight) {
            result.edge_weight =
                malloc(sizeof(*instance->edge_weight) * hm_nentries(n));
        }

        result.profits = malloc(n * sizeof(*result.profits));
        result.demands = malloc(n * sizeof(*result.demands));
        result.positions = malloc(n * sizeof(*result.positions));

        result.name = strdup(instance->name);
        result.comment = strdup(instance->comment);
    }

    if (deep_copy) {
        memcpy(result.profits, instance->profits, n * sizeof(*result.profits));
        memcpy(result.demands, instance->demands, n * sizeof(*result.demands));
        memcpy(result.positions, instance->positions,
               n * sizeof(*result.positions));

        if (instance->edge_weight) {
            memcpy(result.edge_weight, instance->edge_weight,
                   hm_nentries(n) * sizeof(*result.edge_weight));
        }
    }

    return result;
}